

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType dr,int nr,
          vector<double,_std::allocator<double>_> *phiVals)

{
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar6;
  pair<double,_double> pVar7;
  int atid2;
  int atid1;
  CubicSplinePtr cs;
  vector<double,_std::allocator<double>_> rVals;
  EAMInteractionData mixer;
  int local_cc;
  double local_c8;
  __shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> local_c0;
  AtomType *local_b0;
  AtomType *local_a8;
  RealType local_a0;
  _Vector_base<double,_std::allocator<double>_> local_98;
  EAMInteractionData local_78;
  
  local_78.Ci = 0.0;
  local_78.Cj = 0.0;
  local_78.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.phi.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CubicSpline *)0x0;
  local_78.phi.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b0 = atype2;
  local_a8 = atype1;
  local_a0 = dr;
  std::make_shared<OpenMD::CubicSpline>();
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 0;
  if (nr < 1) {
    nr = 0;
  }
  for (; nr != iVar4; iVar4 = iVar4 + 1) {
    local_c8 = (double)iVar4 * local_a0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_98,&local_c8);
  }
  CubicSpline::addPoints
            (local_c0._M_ptr,(vector<double,_std::allocator<double>_> *)&local_98,phiVals);
  std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_78,&local_c0);
  pVar7 = CubicSpline::getLimits
                    (local_78.phi.
                     super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_78.rcut = pVar7.second;
  local_78.explicitlySet = true;
  iVar4 = AtomType::getIdent(local_a8);
  local_c8 = (double)CONCAT44(local_c8._4_4_,iVar4);
  local_cc = AtomType::getIdent(local_b0);
  pVar6 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,(int *)&local_c8);
  if (pVar6.second == false) {
    iVar4 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_c8._0_4_];
  }
  else {
    iVar4 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_c8._0_4_] = iVar4;
    this->nEAM_ = iVar4 + 1;
  }
  pVar6 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,&local_cc);
  if (pVar6.second == false) {
    iVar2 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_cc];
    iVar1 = this->nEAM_;
  }
  else {
    iVar2 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_cc] = iVar2;
    iVar1 = iVar2 + 1;
    this->nEAM_ = iVar1;
  }
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize(this_00,(long)iVar1);
  lVar5 = (long)iVar4;
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5,(long)this->nEAM_);
  lVar3 = (long)iVar2;
  EAMInteractionData::operator=
            ((EAMInteractionData *)
             (lVar3 * 0x40 +
             *(long *)&(this_00->
                       super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar5].
                       super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                       ._M_impl.super__Vector_impl_data),&local_78);
  if (iVar2 != iVar4) {
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar3,(long)this->nEAM_);
    EAMInteractionData::operator=
              ((EAMInteractionData *)
               (lVar5 * 0x40 +
               *(long *)&(this_00->
                         super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar3].
                         super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                         ._M_impl.super__Vector_impl_data),&local_78);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  EAMInteractionData::~EAMInteractionData(&local_78);
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType dr, int nr,
                                   vector<RealType> phiVals) {
    EAMInteractionData mixer;
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};
    vector<RealType> rVals;

    for (int i = 0; i < nr; i++)
      rVals.push_back(i * dr);

    cs->addPoints(rVals, phiVals);
    mixer.phi           = cs;
    mixer.rcut          = mixer.phi->getLimits().second;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;

    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }